

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v6::internal::
     handle_int_type_spec<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>>
               (char spec,int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_> *handler
               )

{
  char in_DIL;
  int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_> *unaff_retaddr;
  int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_> *in_stack_00000060;
  int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_> *in_stack_00000080;
  int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_> *in_stack_00000110;
  
  if (in_DIL == '\0') {
LAB_001b3fdc:
    basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
    ::int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_>::on_dec(in_stack_00000080);
    return;
  }
  if (in_DIL == 'B') {
LAB_001b3ff4:
    basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
    ::int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_>::on_bin(in_stack_00000080);
  }
  else {
    if (in_DIL != 'X') {
      if (in_DIL == 'b') goto LAB_001b3ff4;
      if (in_DIL == 'd') goto LAB_001b3fdc;
      if (in_DIL == 'n') {
        basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
        ::int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_>::on_num
                  (in_stack_00000110);
        return;
      }
      if (in_DIL == 'o') {
        basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
        ::int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_>::on_oct
                  (in_stack_00000080);
        return;
      }
      if (in_DIL != 'x') {
        basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
        ::int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_>::on_error(unaff_retaddr)
        ;
      }
    }
    basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
    ::int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_>::on_hex(in_stack_00000060);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void handle_int_type_spec(char spec, Handler&& handler) {
  switch (spec) {
  case 0:
  case 'd':
    handler.on_dec();
    break;
  case 'x':
  case 'X':
    handler.on_hex();
    break;
  case 'b':
  case 'B':
    handler.on_bin();
    break;
  case 'o':
    handler.on_oct();
    break;
  case 'n':
    handler.on_num();
    break;
  default:
    handler.on_error();
  }
}